

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

void __thiscall QInputDialogPrivate::chooseRightTextInputWidget(QInputDialogPrivate *this)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = useComboBoxOrListView(this);
  uVar1 = (this->opts).super_QFlagsStorageHelper<QInputDialog::InputDialogOption,_4>.
          super_QFlagsStorage<QInputDialog::InputDialogOption>.i;
  if (bVar2) {
    lVar3 = 0x310;
    if ((uVar1 & 2) != 0) {
      bVar2 = QComboBox::isEditable(this->comboBox);
      if (!bVar2) {
        ensureListView(this);
        lVar3 = 0x318;
      }
    }
  }
  else if ((uVar1 & 4) == 0) {
    ensureLineEdit(this);
    lVar3 = 0x2f0;
  }
  else {
    ensurePlainTextEdit(this);
    lVar3 = 0x2f8;
  }
  setInputWidget(this,*(QWidget **)
                       (&(this->super_QDialogPrivate).super_QWidgetPrivate.super_QObjectPrivate +
                       lVar3));
  if (this->inputWidget == &this->comboBox->super_QWidget) {
    QComboBox::currentText((QString *)&local_30,(QComboBox *)&this->comboBox->super_QWidget);
  }
  else {
    if (this->inputWidget != (QWidget *)this->listView) goto LAB_004b5eb0;
    listViewText((QString *)&local_30,this);
  }
  textChanged(this,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
LAB_004b5eb0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::chooseRightTextInputWidget()
{
    QWidget *widget;

    if (useComboBoxOrListView()) {
        if ((opts & QInputDialog::UseListViewForComboBoxItems) && !comboBox->isEditable()) {
            ensureListView();
            widget = listView;
        } else {
            widget = comboBox;
        }
    } else if (opts & QInputDialog::UsePlainTextEditForTextInput) {
        ensurePlainTextEdit();
        widget = plainTextEdit;
    } else {
        ensureLineEdit();
        widget = lineEdit;
    }

    setInputWidget(widget);

    if (inputWidget == comboBox) {
        textChanged(comboBox->currentText());
    } else if (inputWidget == listView) {
        textChanged(listViewText());
    }
}